

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_assertion_tests.cpp
# Opt level: O0

void __thiscall
iu_Expression_x_iutest_x_VariadicMacro_Test::iu_Expression_x_iutest_x_VariadicMacro_Test
          (iu_Expression_x_iutest_x_VariadicMacro_Test *this)

{
  iu_Expression_x_iutest_x_VariadicMacro_Test *this_local;
  
  iutest::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__iu_Expression_x_iutest_x_VariadicMacro_Test_00196668;
  return;
}

Assistant:

IUTEST(Expression, VariadicMacro)
{
    IUTEST_ASSERT(x<int, int>(1, 42) == 42);
    IUTEST_EXPECT(x<int, int>(1, 42) == 42);
    IUTEST_INFORM(x<int, int>(1, 42) == 42);
    IUTEST_ASSUME(x<int, int>(1, 42) == 42);
    IUTEST_ASSERT_NOT(x<int, int>(1, 42) != 42);
    IUTEST_EXPECT_NOT(x<int, int>(1, 42) != 42);
    IUTEST_INFORM_NOT(x<int, int>(1, 42) != 42);
    IUTEST_ASSUME_NOT(x<int, int>(1, 42) != 42);
}